

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptNumberObject * __thiscall
Js::JavascriptLibrary::CreateNumberObject(JavascriptLibrary *this,Var number)

{
  code *pcVar1;
  Var value;
  bool bVar2;
  DynamicType **ppDVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  JavascriptNumberObject *this_00;
  TrackAllocData local_40;
  Var local_18;
  Var number_local;
  JavascriptLibrary *this_local;
  
  local_18 = number;
  number_local = this;
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->numberTypeDynamic);
  if (*ppDVar3 == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1b85,"(numberTypeDynamic)","Where\'s numberTypeDynamic?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&JavascriptNumberObject::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1b86);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_40);
  this_00 = (JavascriptNumberObject *)new<Memory::Recycler>(0x28,pRVar5,0x43c4b0);
  value = local_18;
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->numberTypeDynamic);
  JavascriptNumberObject::JavascriptNumberObject(this_00,value,*ppDVar3);
  return this_00;
}

Assistant:

JavascriptNumberObject* JavascriptLibrary::CreateNumberObject(Var number)
    {
        AssertMsg(numberTypeDynamic, "Where's numberTypeDynamic?");
        return RecyclerNew(this->GetRecycler(), JavascriptNumberObject, number, numberTypeDynamic);
    }